

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O2

WebPMux * WebPNewInternal(int version)

{
  WebPMux *pWVar1;
  
  if (((version & 0xffffff00U) == 0x100) &&
     (pWVar1 = (WebPMux *)WebPSafeMalloc(1,0x40), pWVar1 != (WebPMux *)0x0)) {
    pWVar1->unknown_ = (WebPChunk *)0x0;
    pWVar1->canvas_width_ = 0;
    pWVar1->canvas_height_ = 0;
    pWVar1->anim_ = (WebPChunk *)0x0;
    pWVar1->vp8x_ = (WebPChunk *)0x0;
    pWVar1->exif_ = (WebPChunk *)0x0;
    pWVar1->xmp_ = (WebPChunk *)0x0;
    pWVar1->images_ = (WebPMuxImage *)0x0;
    pWVar1->iccp_ = (WebPChunk *)0x0;
    return pWVar1;
  }
  return (WebPMux *)0x0;
}

Assistant:

WebPMux* WebPNewInternal(int version) {
  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_MUX_ABI_VERSION)) {
    return NULL;
  } else {
    WebPMux* const mux = (WebPMux*)WebPSafeMalloc(1ULL, sizeof(WebPMux));
    if (mux != NULL) MuxInit(mux);
    return mux;
  }
}